

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlAutoCloseTag(htmlDocPtr doc,xmlChar *name,htmlNodePtr elem)

{
  int iVar1;
  void *pvVar2;
  _xmlNode *elem_00;
  xmlChar *local_30;
  xmlChar *local_28;
  
  iVar1 = 1;
  if (elem != (htmlNodePtr)0x0) {
    iVar1 = xmlStrEqual(name,elem->name);
    if (iVar1 == 0) {
      local_28 = elem->name;
      local_30 = name;
      pvVar2 = bsearch(&local_30,htmlStartClose,0xf9,0x10,htmlCompareStartClose);
      if (pvVar2 != (void *)0x0) {
        return 1;
      }
      for (elem_00 = elem->children; elem_00 != (htmlNodePtr)0x0; elem_00 = elem_00->next) {
        iVar1 = htmlAutoCloseTag(doc,name,elem_00);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
htmlAutoCloseTag(htmlDocPtr doc, const xmlChar *name, htmlNodePtr elem) {
    htmlNodePtr child;

    if (elem == NULL) return(1);
    if (xmlStrEqual(name, elem->name)) return(0);
    if (htmlCheckAutoClose(elem->name, name)) return(1);
    child = elem->children;
    while (child != NULL) {
        if (htmlAutoCloseTag(doc, name, child)) return(1);
	child = child->next;
    }
    return(0);
}